

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O3

void setup_blocked_signals(sigaction *signal_action,int flags)

{
  (signal_action->__sigaction_handler).sa_handler = (__sighandler_t)0x0;
  if ((flags & 1U) != 0) {
    sigaddset((sigset_t *)&signal_action->sa_mask,10);
  }
  if ((flags & 2U) != 0) {
    sigaddset((sigset_t *)&signal_action->sa_mask,0xc);
  }
  sigprocmask(0,(sigset_t *)&signal_action->sa_mask,(sigset_t *)0x0);
  return;
}

Assistant:

void setup_blocked_signals(struct sigaction *signal_action, int flags) {
	signal_action->sa_handler = SIG_DFL;

	// Block SIGUSR1 ?
	if (flags & BLOCK_USR1) {
		sigaddset(&signal_action->sa_mask, SIGUSR1);
	}

	// Block SIGUSR2 ?
	if (flags & BLOCK_USR2) {
		sigaddset(&signal_action->sa_mask, SIGUSR2);
	}

	// Change signal mask
	sigprocmask(SIG_BLOCK, &signal_action->sa_mask, NULL);
}